

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O1

void __thiscall
JsrtExternalType::JsrtExternalType
          (JsrtExternalType *this,ScriptContext *scriptContext,JsFinalizeCallback finalizeCallback,
          RecyclableObject *prototype)

{
  Type *pTVar1;
  DynamicTypeHandler *typeHandler;
  
  typeHandler = (DynamicTypeHandler *)
                Js::PathTypeHandlerNoAttr::New
                          (scriptContext,
                           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->rootPath).
                           ptr,0,0,0,true,true,(DynamicType *)0x0);
  Js::DynamicType::DynamicType
            (&this->super_DynamicType,scriptContext,TypeIds_Object,prototype,(JavascriptMethod)0x0,
             typeHandler,true,true);
  this->jsFinalizeCallback = finalizeCallback;
  this->jsTraceCallback = (Type)0x0;
  pTVar1 = &(this->super_DynamicType).super_Type.flags;
  *pTVar1 = *pTVar1 | TypeFlagMask_JsrtExternal;
  return;
}

Assistant:

JsrtExternalType::JsrtExternalType(Js::ScriptContext* scriptContext, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype)
    : Js::DynamicType(
        scriptContext,
        Js::TypeIds_Object,
        prototype,
        nullptr,
        Js::PathTypeHandlerNoAttr::New(scriptContext, scriptContext->GetLibrary()->GetRootPath(), 0, 0, 0, true, true),
        true,
        true)
#ifdef _CHAKRACOREBUILD
    , jsTraceCallback(nullptr)
#endif
    , jsFinalizeCallback(finalizeCallback)
{
    this->flags |= TypeFlagMask_JsrtExternal;
}